

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.h
# Opt level: O0

void __thiscall
TypeGenericClassProto::TypeGenericClassProto
          (TypeGenericClassProto *this,SynIdentifier *identifier,SynBase *source,ScopeData *scope,
          SynClassDefinition *definition)

{
  SynClassDefinition *definition_local;
  ScopeData *scope_local;
  SynBase *source_local;
  SynIdentifier *identifier_local;
  TypeGenericClassProto *this_local;
  
  TypeBase::TypeBase(&this->super_TypeBase,0x16,identifier->name);
  (this->super_TypeBase)._vptr_TypeBase = (_func_int **)&PTR__TypeGenericClassProto_0052c660;
  SynIdentifier::SynIdentifier(&this->identifier,identifier);
  this->source = source;
  this->scope = scope;
  this->definition = definition;
  IntrusiveList<ExprBase>::IntrusiveList(&this->instances);
  (this->super_TypeBase).isGeneric = true;
  return;
}

Assistant:

TypeGenericClassProto(const SynIdentifier& identifier, SynBase *source, ScopeData *scope, SynClassDefinition *definition): TypeBase(myTypeID, identifier.name), identifier(identifier), source(source), scope(scope), definition(definition)
	{
		isGeneric = true;
	}